

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-2.c
# Opt level: O2

int FeederBigRand1(void)

{
  ulong __n;
  DWORD DVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  DWORD DVar5;
  FILE *__stream;
  size_t sVar6;
  bool bVar7;
  char pattern [17];
  
  __stream = fopen("in.txt","w");
  if (__stream == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
  }
  else {
    if (testN - 0x10U < 2) {
      uVar3 = seed[testN - 0x10U];
      printf("Creating large text with seed %u... ",(ulong)uVar3);
      fflush(_stdout);
      builtin_strncpy(pattern,"0123456789abcdef",0x11);
      srand(uVar3);
      DVar1 = GetTickCount();
      iVar2 = fputs(pattern,__stream);
      if ((iVar2 != -1) && (iVar2 = fputc(10,__stream), iVar2 != -1)) {
        iVar2 = 0x7fffff;
        do {
          while( true ) {
            bVar7 = iVar2 == 0;
            iVar2 = iVar2 + -1;
            if (bVar7) {
              iVar2 = fputs(pattern,__stream);
              if (iVar2 != -1) {
                fclose(__stream);
                DVar5 = GetTickCount();
                uVar3 = RoundUptoThousand(DVar5 - DVar1);
                printf("done in T=%u seconds. Starting exe with timeout 6*T... ",(ulong)uVar3 / 1000
                       ,(ulong)uVar3 % 1000);
                LabTimeout = uVar3 * 6;
                fflush(_stdout);
                return 0;
              }
              goto LAB_00102637;
            }
            uVar3 = rand();
            __n = (ulong)uVar3 % 0x11;
            if ((int)__n == 0) break;
            sVar6 = fwrite(pattern,1,__n,__stream);
            if (sVar6 != __n) goto LAB_00102637;
          }
          iVar4 = putc(0x20,__stream);
        } while (iVar4 != -1);
      }
LAB_00102637:
      puts("can\'t write in in.txt. No space on disk?");
    }
    else {
      puts("\nInternal error: incorrect test number");
      testN = testN + 1;
    }
    fclose(__stream);
  }
  return -1;
}

Assistant:

static int FeederBigRand1(void) {
    FILE *const in = fopen("in.txt", "w");
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    unsigned int bigTestN = testN - sizeof(testInOut) / sizeof(testInOut[0]);
    if (bigTestN >= sizeof(seed) / sizeof(seed[0])) {
        printf("\nInternal error: incorrect test number\n");
        ++testN;
        fclose(in);
        return -1;
    }
    printf("Creating large text with seed %u... ", seed[bigTestN]);
    fflush(stdout);
    const char pattern[] = "0123456789abcdef";
    srand(seed[bigTestN]);
    DWORD t = GetTickCount();
    if (fputs(pattern, in) == EOF || fputc('\n',in) == EOF) {
        printf("can't write in in.txt. No space on disk?\n");
        fclose(in);
        return -1;
    }
    for (unsigned int i = 1; i < 1024 * 1024 * 8; ++i) {
        unsigned int randomPrefixLength = (unsigned int)rand() % 17;
        if (randomPrefixLength == 0) {
            if (putc(' ', in) == EOF) {
                printf("can't write in in.txt. No space on disk?\n");
                fclose(in);
                return -1;
            }
        } else {
            if (fwrite(pattern, 1, randomPrefixLength, in) != randomPrefixLength) {
                printf("can't write in in.txt. No space on disk?\n");
                fclose(in);
                return -1;
            }
        }

    }
    if (fputs(pattern, in) == EOF) {
        printf("can't write in in.txt. No space on disk?\n");
        fclose(in);
        return -1;
    }
    fclose(in);
    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 6*T... ", (unsigned)(t / 1000));
    LabTimeout = (int)t * 6;
    fflush(stdout);
    return 0;
}